

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
          (ForeachLoopListSyntax *this,Token openParen,NameSyntax *arrayName,Token openBracket,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *loopVariables,Token closeBracket,
          Token closeParen)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = openBracket._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).kind = ForeachLoopList;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->arrayName).ptr = arrayName;
  (this->openBracket).kind = (short)uVar6;
  (this->openBracket).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openBracket).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openBracket).info = openBracket.info;
  uVar3 = *(undefined4 *)&(loopVariables->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (loopVariables->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.kind =
       (loopVariables->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->loopVariables).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (loopVariables->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->loopVariables).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (this->loopVariables).super_SyntaxListBase.childCount =
       (loopVariables->super_SyntaxListBase).childCount;
  (this->loopVariables).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d55c8;
  sVar2 = (loopVariables->elements)._M_extent._M_extent_value;
  (this->loopVariables).elements._M_ptr = (loopVariables->elements)._M_ptr;
  (this->loopVariables).elements._M_extent._M_extent_value = sVar2;
  (this->closeBracket).kind = closeBracket.kind;
  (this->closeBracket).field_0x2 = closeBracket._2_1_;
  (this->closeBracket).numFlags = (NumericTokenFlags)closeBracket.numFlags.raw;
  (this->closeBracket).rawLen = closeBracket.rawLen;
  (this->closeBracket).info = closeBracket.info;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (arrayName->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->loopVariables).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->loopVariables).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

ForeachLoopListSyntax(Token openParen, NameSyntax& arrayName, Token openBracket, const SeparatedSyntaxList<NameSyntax>& loopVariables, Token closeBracket, Token closeParen) :
        SyntaxNode(SyntaxKind::ForeachLoopList), openParen(openParen), arrayName(&arrayName), openBracket(openBracket), loopVariables(loopVariables), closeBracket(closeBracket), closeParen(closeParen) {
        this->arrayName->parent = this;
        this->loopVariables.parent = this;
        for (auto child : this->loopVariables)
            child->parent = this;
    }